

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fan_calculator.cpp
# Opt level: O0

void mahjong::adjust_fan_table(fan_table_t *fan_table)

{
  fan_table_t *fan_table_local;
  
  if ((*fan_table)[1] != 0) {
    (*fan_table)[0x26] = 0;
    (*fan_table)[0x30] = 0;
    (*fan_table)[0x49] = 0;
  }
  if ((*fan_table)[2] != 0) {
    (*fan_table)[0x36] = 0;
    (*fan_table)[0x3b] = 0;
  }
  if ((*fan_table)[3] != 0) {
    (*fan_table)[0x31] = 0;
    (*fan_table)[0x4b] = 0;
  }
  if ((*fan_table)[4] != 0) {
    (*fan_table)[0x16] = 0;
    (*fan_table)[0x3e] = 0;
    (*fan_table)[0x49] = (*fan_table)[0x49] - 1;
    (*fan_table)[0x4b] = 0;
    (*fan_table)[0x4c] = 0;
    if ((*fan_table)[0x38] != 0) {
      (*fan_table)[0x38] = 0;
      (*fan_table)[0x50] = 1;
    }
  }
  if ((*fan_table)[5] != 0) {
    (*fan_table)[0x4f] = 0;
  }
  if ((*fan_table)[6] != 0) {
    (*fan_table)[0x13] = 0;
    (*fan_table)[0x16] = 0;
    (*fan_table)[0x3e] = 0;
    (*fan_table)[0x4b] = 0;
    (*fan_table)[0x4c] = 0;
  }
  if ((*fan_table)[7] != 0) {
    (*fan_table)[0x33] = 0;
    (*fan_table)[0x3e] = 0;
    (*fan_table)[0x4f] = 0;
  }
  if ((*fan_table)[8] != 0) {
    (*fan_table)[0x12] = 0;
    (*fan_table)[0x30] = 0;
    (*fan_table)[0x37] = 0;
    (*fan_table)[0x49] = 0;
    (*fan_table)[0x4c] = 0;
    (*fan_table)[0x41] = 0;
  }
  if ((*fan_table)[9] != 0) {
    (*fan_table)[0x26] = 0;
    (*fan_table)[0x49] = 0;
  }
  if ((*fan_table)[10] != 0) {
    (*fan_table)[0x36] = 0;
    (*fan_table)[0x3b] = 0;
  }
  if ((*fan_table)[0xb] != 0) {
    (*fan_table)[0x12] = 0;
    (*fan_table)[0x30] = 0;
    (*fan_table)[0x37] = 0;
    (*fan_table)[0x49] = 0;
    (*fan_table)[0x4b] = 0;
  }
  if ((*fan_table)[0xc] != 0) {
    (*fan_table)[0x30] = 0;
    (*fan_table)[0x3e] = 0;
    if ((*fan_table)[0x38] != 0) {
      (*fan_table)[0x38] = 0;
      (*fan_table)[0x50] = 1;
    }
  }
  if ((*fan_table)[0xd] != 0) {
    (*fan_table)[0x13] = 0;
    (*fan_table)[0x16] = 0;
    (*fan_table)[0x3f] = 0;
    (*fan_table)[0x45] = 0;
    (*fan_table)[0x48] = 0;
    (*fan_table)[0x4b] = 0;
    (*fan_table)[0x4c] = 0;
  }
  if ((*fan_table)[0xe] != 0) {
    (*fan_table)[0x18] = 0;
    (*fan_table)[0x40] = 0;
    (*fan_table)[0x45] = 0;
  }
  if ((*fan_table)[0xf] != 0) {
    (*fan_table)[0x17] = 0;
    (*fan_table)[0x30] = 0;
  }
  if ((*fan_table)[0x10] != 0) {
    (*fan_table)[0x1e] = 0;
    (*fan_table)[0x48] = 0;
    (*fan_table)[0x47] = 0;
  }
  if ((*fan_table)[0x12] != 0) {
    (*fan_table)[0x30] = 0;
    (*fan_table)[0x37] = 0;
    (*fan_table)[0x49] = 0;
  }
  if ((*fan_table)[0x13] != 0) {
    (*fan_table)[0x3e] = 0;
    (*fan_table)[0x4f] = 0;
  }
  if ((*fan_table)[0x14] != 0) {
    (*fan_table)[0x33] = 0;
    (*fan_table)[0x3e] = 0;
  }
  if ((*fan_table)[0x15] != 0) {
    (*fan_table)[0x30] = 0;
    (*fan_table)[0x44] = 0;
    (*fan_table)[0x4c] = 0;
  }
  if ((*fan_table)[0x16] != 0) {
    (*fan_table)[0x4b] = 0;
    (*fan_table)[0x4c] = 0;
  }
  if ((*fan_table)[0x17] != 0) {
    (*fan_table)[0x18] = 0;
    (*fan_table)[0x45] = 0;
  }
  if ((*fan_table)[0x18] != 0) {
    (*fan_table)[0x17] = 0;
  }
  if ((*fan_table)[0x19] != 0) {
    (*fan_table)[0x24] = 0;
    (*fan_table)[0x4c] = 0;
  }
  if ((*fan_table)[0x1a] != 0) {
    (*fan_table)[0x44] = 0;
    (*fan_table)[0x4c] = 0;
  }
  if ((*fan_table)[0x1b] != 0) {
    (*fan_table)[0x25] = 0;
    (*fan_table)[0x4c] = 0;
  }
  if ((*fan_table)[0x1d] != 0) {
    (*fan_table)[0x3f] = 0;
    (*fan_table)[0x4c] = 0;
    (*fan_table)[0x46] = 0;
    (*fan_table)[0x48] = 0;
  }
  if ((*fan_table)[0x1f] != 0) {
    (*fan_table)[0x44] = 0;
    (*fan_table)[0x4c] = 0;
  }
  if ((*fan_table)[0x22] != 0) {
    (*fan_table)[0x33] = 0;
    (*fan_table)[0x3e] = 0;
  }
  if ((*fan_table)[0x24] != 0) {
    (*fan_table)[0x4c] = 0;
  }
  if ((*fan_table)[0x25] != 0) {
    (*fan_table)[0x4c] = 0;
  }
  if ((((*fan_table)[0x26] != 0) && ((*fan_table)[0xb] == 0)) && ((*fan_table)[0x12] == 0)) {
    if ((*fan_table)[0x49] < 3) {
      __assert_fail("fan_table[PUNG_OF_TERMINALS_OR_HONORS] >= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fishiu[P]mahjong/MahjongGB/./mahjong-algorithm/fan_calculator.cpp"
                    ,0x5c6,"void mahjong::adjust_fan_table(fan_table_t &)");
    }
    (*fan_table)[0x49] = (*fan_table)[0x49] - 3;
  }
  if ((*fan_table)[0x28] != 0) {
    (*fan_table)[0x4b] = 0;
  }
  if ((*fan_table)[0x2c] != 0) {
    (*fan_table)[0x50] = 0;
  }
  if ((*fan_table)[0x2e] != 0) {
    (*fan_table)[0x50] = 0;
  }
  if ((*fan_table)[0x2f] != 0) {
    (*fan_table)[0x3a] = 0;
  }
  if ((*fan_table)[0x35] != 0) {
    (*fan_table)[0x43] = 0;
  }
  if ((*fan_table)[0x31] != 0) {
    (*fan_table)[0x4b] = 0;
  }
  if ((*fan_table)[0x34] != 0) {
    (*fan_table)[0x4f] = 0;
  }
  if ((*fan_table)[0x36] != 0) {
    (*fan_table)[0x3b] = 0;
  }
  if ((*fan_table)[0x38] != 0) {
    (*fan_table)[0x50] = 0;
  }
  if ((*fan_table)[0x39] != 0) {
    (*fan_table)[0x4a] = 0;
  }
  if ((*fan_table)[0x3f] != 0) {
    (*fan_table)[0x4c] = 0;
  }
  if ((*fan_table)[0x44] != 0) {
    (*fan_table)[0x4c] = 0;
  }
  return;
}

Assistant:

static void adjust_fan_table(fan_table_t &fan_table) {
    // 大四喜不计三风刻、碰碰和、圈风刻、门风刻、幺九刻
    if (fan_table[BIG_FOUR_WINDS]) {
        fan_table[BIG_THREE_WINDS] = 0;
        fan_table[ALL_PUNGS] = 0;
        fan_table[PUNG_OF_TERMINALS_OR_HONORS] = 0;
    }
    // 大三元不计双箭刻、箭刻（严格98规则不计缺一门）
    if (fan_table[BIG_THREE_DRAGONS]) {
        fan_table[TWO_DRAGONS_PUNGS] = 0;
        fan_table[DRAGON_PUNG] = 0;
#ifdef STRICT_98_RULE
        fan_table[ONE_VOIDED_SUIT] = 0;
#endif
    }
    // 绿一色不计混一色、缺一门
    if (fan_table[ALL_GREEN]) {
        fan_table[HALF_FLUSH] = 0;
        fan_table[ONE_VOIDED_SUIT] = 0;
    }
    // 九莲宝灯不计清一色、门前清、缺一门、无字，减计1个幺九刻，把不求人修正为自摸
    if (fan_table[NINE_GATES]) {
        fan_table[FULL_FLUSH] = 0;
        fan_table[CONCEALED_HAND] = 0;
        --fan_table[PUNG_OF_TERMINALS_OR_HONORS];
        fan_table[ONE_VOIDED_SUIT] = 0;
        fan_table[NO_HONORS] = 0;
        if (fan_table[FULLY_CONCEALED_HAND]) {
            fan_table[FULLY_CONCEALED_HAND] = 0;
            fan_table[SELF_DRAWN] = 1;
        }
    }
    // 四杠不计单钓将
    if (fan_table[FOUR_KONGS]) {
        fan_table[SINGLE_WAIT] = 0;
    }
    // 连七对不计七对、清一色、门前清、缺一门、无字
    if (fan_table[SEVEN_SHIFTED_PAIRS]) {
        fan_table[SEVEN_PAIRS] = 0;
        fan_table[FULL_FLUSH] = 0;
        fan_table[CONCEALED_HAND] = 0;
        fan_table[ONE_VOIDED_SUIT] = 0;
        fan_table[NO_HONORS] = 0;
    }
    // 十三幺不计五门齐、门前清、单钓将
    if (fan_table[THIRTEEN_ORPHANS]) {
        fan_table[ALL_TYPES] = 0;
        fan_table[CONCEALED_HAND] = 0;
        fan_table[SINGLE_WAIT] = 0;
    }

    // 清幺九不计混幺九、碰碰胡、全带幺、幺九刻、无字（严格98规则不计双同刻、不计三同刻）
    if (fan_table[ALL_TERMINALS]) {
        fan_table[ALL_TERMINALS_AND_HONORS] = 0;
        fan_table[ALL_PUNGS] = 0;
        fan_table[OUTSIDE_HAND] = 0;
        fan_table[PUNG_OF_TERMINALS_OR_HONORS] = 0;
        fan_table[NO_HONORS] = 0;
        fan_table[DOUBLE_PUNG] = 0;  // 通行计法不计双同刻
#ifdef STRICT_98_RULE
        fan_table[TRIPLE_PUNG] = 0;
        fan_table[DOUBLE_PUNG] = 0;
#endif
    }

    // 小四喜不计三风刻
    if (fan_table[LITTLE_FOUR_WINDS]) {
        fan_table[BIG_THREE_WINDS] = 0;
        // 小四喜的第四组牌如果是19的刻子，则是混幺九；如果是箭刻则是字一色；这两种都是不计幺九刻的
        // 如果是顺子或者2-8的刻子，则不存在多余的幺九刻
        // 所以这里将幺九刻置为0
        fan_table[PUNG_OF_TERMINALS_OR_HONORS] = 0;
    }

    // 小三元不计双箭刻、箭刻（严格98规则不计缺一门）
    if (fan_table[LITTLE_THREE_DRAGONS]) {
        fan_table[TWO_DRAGONS_PUNGS] = 0;
        fan_table[DRAGON_PUNG] = 0;
#ifdef STRICT_98_RULE
        fan_table[ONE_VOIDED_SUIT] = 0;
#endif
    }

    // 字一色不计混幺九、碰碰胡、全带幺、幺九刻、缺一门
    if (fan_table[ALL_HONORS]) {
        fan_table[ALL_TERMINALS_AND_HONORS] = 0;
        fan_table[ALL_PUNGS] = 0;
        fan_table[OUTSIDE_HAND] = 0;
        fan_table[PUNG_OF_TERMINALS_OR_HONORS] = 0;
        fan_table[ONE_VOIDED_SUIT] = 0;
    }
    // 四暗刻不计碰碰和、门前清，把不求人修正为自摸
    if (fan_table[FOUR_CONCEALED_PUNGS]) {
        fan_table[ALL_PUNGS] = 0;
        fan_table[CONCEALED_HAND] = 0;
        if (fan_table[FULLY_CONCEALED_HAND]) {
            fan_table[FULLY_CONCEALED_HAND] = 0;
            fan_table[SELF_DRAWN] = 1;
        }
    }
    // 一色双龙会不计七对、清一色、平和、一般高、老少副、缺一门、无字
    if (fan_table[PURE_TERMINAL_CHOWS]) {
        fan_table[SEVEN_PAIRS] = 0;
        fan_table[FULL_FLUSH] = 0;
        fan_table[ALL_CHOWS] = 0;
        fan_table[PURE_DOUBLE_CHOW] = 0;
        fan_table[TWO_TERMINAL_CHOWS] = 0;
        fan_table[ONE_VOIDED_SUIT] = 0;
        fan_table[NO_HONORS] = 0;
    }

    // 一色四同顺不计一色三同顺、一般高、四归一（严格98规则不计缺一门）
    if (fan_table[QUADRUPLE_CHOW]) {
        fan_table[PURE_SHIFTED_PUNGS] = 0;
        fan_table[TILE_HOG] = 0;
        fan_table[PURE_DOUBLE_CHOW] = 0;
#ifdef STRICT_98_RULE
        fan_table[ONE_VOIDED_SUIT] = 0;
#endif
    }
    // 一色四节高不计一色三节高、碰碰和（严格98规则不计缺一门）
    if (fan_table[FOUR_PURE_SHIFTED_PUNGS]) {
        fan_table[PURE_TRIPLE_CHOW] = 0;
        fan_table[ALL_PUNGS] = 0;
#ifdef STRICT_98_RULE
        fan_table[ONE_VOIDED_SUIT] = 0;
#endif
    }

    // 一色四步高不计一色三步高、老少副、连六（严格98规则不计缺一门）
    if (fan_table[FOUR_PURE_SHIFTED_CHOWS]) {
        fan_table[PURE_SHIFTED_CHOWS] = 0;
        fan_table[TWO_TERMINAL_CHOWS] = 0;
        fan_table[SHORT_STRAIGHT] = 0;
#ifdef STRICT_98_RULE
        fan_table[ONE_VOIDED_SUIT] = 0;
#endif
    }

    // 混幺九不计碰碰和、全带幺、幺九刻
    if (fan_table[ALL_TERMINALS_AND_HONORS]) {
        fan_table[ALL_PUNGS] = 0;
        fan_table[OUTSIDE_HAND] = 0;
        fan_table[PUNG_OF_TERMINALS_OR_HONORS] = 0;
    }

    // 七对不计门前清、单钓将
    if (fan_table[SEVEN_PAIRS]) {
        fan_table[CONCEALED_HAND] = 0;
        fan_table[SINGLE_WAIT] = 0;
    }
    // 七星不靠不计五门齐、门前清
    if (fan_table[GREATER_HONORS_AND_KNITTED_TILES]) {
        fan_table[ALL_TYPES] = 0;
        fan_table[CONCEALED_HAND] = 0;
    }
    // 全双刻不计碰碰胡、断幺、无字
    if (fan_table[ALL_EVEN_PUNGS]) {
        fan_table[ALL_PUNGS] = 0;
        fan_table[ALL_SIMPLES] = 0;
        fan_table[NO_HONORS] = 0;
    }
    // 清一色不计缺一门、无字
    if (fan_table[FULL_FLUSH]) {
        fan_table[ONE_VOIDED_SUIT] = 0;
        fan_table[NO_HONORS] = 0;
    }
    // 一色三同顺不计一色三节高、一般高
    if (fan_table[PURE_TRIPLE_CHOW]) {
        fan_table[PURE_SHIFTED_PUNGS] = 0;
        fan_table[PURE_DOUBLE_CHOW] = 0;
    }
    // 一色三节高不计一色三同顺
    if (fan_table[PURE_SHIFTED_PUNGS]) {
        fan_table[PURE_TRIPLE_CHOW] = 0;
    }
    // 全大不计大于五、无字
    if (fan_table[UPPER_TILES]) {
        fan_table[UPPER_FOUR] = 0;
        fan_table[NO_HONORS] = 0;
    }
    // 全中不计断幺
    if (fan_table[MIDDLE_TILES]) {
        fan_table[ALL_SIMPLES] = 0;
        fan_table[NO_HONORS] = 0;
    }
    // 全小不计小于五、无字
    if (fan_table[LOWER_TILES]) {
        fan_table[LOWER_FOUR] = 0;
        fan_table[NO_HONORS] = 0;
    }

    // 三色双龙会不计平和、无字、喜相逢、老少副
    if (fan_table[THREE_SUITED_TERMINAL_CHOWS]) {
        fan_table[ALL_CHOWS] = 0;
        fan_table[NO_HONORS] = 0;
        fan_table[MIXED_DOUBLE_CHOW] = 0;
        fan_table[TWO_TERMINAL_CHOWS] = 0;
    }
    // 全带五不计断幺、无字
    if (fan_table[ALL_FIVE]) {
        fan_table[ALL_SIMPLES] = 0;
        fan_table[NO_HONORS] = 0;
    }

    // 七星不靠不计五门齐、门前清
    if (fan_table[LESSER_HONORS_AND_KNITTED_TILES]) {
        fan_table[ALL_TYPES] = 0;
        fan_table[CONCEALED_HAND] = 0;
    }
    // 大于五不计无字
    if (fan_table[UPPER_FOUR]) {
        fan_table[NO_HONORS] = 0;
    }
    // 小于五不计无字
    if (fan_table[LOWER_FOUR]) {
        fan_table[NO_HONORS] = 0;
    }
    // 三风刻内部不再计幺九刻（严格98规则不计缺一门）
    if (fan_table[BIG_THREE_WINDS]) {
        // 如果不是字一色或混幺九，则要减去3个幺九刻
        if (!fan_table[ALL_HONORS] && !fan_table[ALL_TERMINALS_AND_HONORS]) {
            assert(fan_table[PUNG_OF_TERMINALS_OR_HONORS] >= 3);
            fan_table[PUNG_OF_TERMINALS_OR_HONORS] -= 3;
        }
#ifdef STRICT_98_RULE
        fan_table[ONE_VOIDED_SUIT] = 0;
#endif
    }

    // 推不倒不计缺一门
    if (fan_table[REVERSIBLE_TILES]) {
        fan_table[ONE_VOIDED_SUIT] = 0;
    }
    // 妙手回春不计自摸
    if (fan_table[LAST_TILE_DRAW]) {
        fan_table[SELF_DRAWN] = 0;
    }
    // 杠上开花不计自摸
    if (fan_table[OUT_WITH_REPLACEMENT_TILE]) {
        fan_table[SELF_DRAWN] = 0;
    }
    // 抢杠和不计和绝张
    if (fan_table[ROBBING_THE_KONG]) {
        fan_table[LAST_TILE] = 0;
    }
    // 双暗杠不计暗杠
    if (fan_table[TWO_CONCEALED_KONGS]) {
        fan_table[CONCEALED_KONG] = 0;
    }

    // 混一色不计缺一门
    if (fan_table[HALF_FLUSH]) {
        fan_table[ONE_VOIDED_SUIT] = 0;
    }
    // 全求人不计单钓将
    if (fan_table[MELDED_HAND]) {
        fan_table[SINGLE_WAIT] = 0;
    }
    // 双箭刻不计箭刻
    if (fan_table[TWO_DRAGONS_PUNGS]) {
        fan_table[DRAGON_PUNG] = 0;
    }

    // 不求人不计自摸
    if (fan_table[FULLY_CONCEALED_HAND]) {
        fan_table[SELF_DRAWN] = 0;
    }
    // 双明杠不计明杠
    if (fan_table[TWO_MELDED_KONGS]) {
        fan_table[MELDED_KONG] = 0;
    }

    // 平和不计无字
    if (fan_table[ALL_CHOWS]) {
        fan_table[NO_HONORS] = 0;
    }
    // 断幺不计无字
    if (fan_table[ALL_SIMPLES]) {
        fan_table[NO_HONORS] = 0;
    }
}